

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O3

UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> * __thiscall
flow::IRBuilder::
insert<flow::UnaryInstr<(flow::UnaryOperator)1,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,Value **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  tuple<flow::Instr_*,_std::default_delete<flow::Instr>_> this_00;
  UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *pUVar1;
  pointer *__ptr;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> local_28;
  
  this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
  super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)operator_new(0x70);
  UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2>::UnaryInstr
            ((UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *)
             this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
             super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl,*args,args_1);
  local_28._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
  super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
       (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
       (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
       this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
       super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
  pUVar1 = (UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *)
           insert(this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_28);
  if ((_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)
      local_28._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                          super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl + 8))();
  }
  return pUVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }